

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

CURLUcode parse_authority(Curl_URL *u,char *auth,size_t authlen,uint flags,dynbuf *host,
                         _Bool has_scheme)

{
  uint uVar1;
  uint uVar2;
  Curl_URL *pCVar3;
  CURLcode CVar4;
  int iVar5;
  CURLUcode CVar6;
  void *pvVar7;
  Curl_handler *pCVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char cVar12;
  ulong uVar13;
  long lVar14;
  char **optionsp_00;
  ulong uVar15;
  undefined7 in_register_00000089;
  ulong uVar16;
  dynbuf *pdVar17;
  ulong uVar18;
  char *passwdp;
  char *userp;
  char *optionsp;
  char *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  char *local_58;
  Curl_URL *local_50;
  dynbuf *local_48;
  uint local_40;
  undefined4 local_3c;
  size_t local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000089,has_scheme);
  local_68 = (char *)0x0;
  local_70 = (char *)0x0;
  local_58 = (char *)0x0;
  local_48 = host;
  local_38 = authlen;
  pvVar7 = memchr(auth,0x40,authlen);
  CVar6 = CURLUE_OK;
  pcVar9 = (char *)0x0;
  if (pvVar7 == (void *)0x0) {
LAB_001644a8:
    (*Curl_cfree)(pcVar9);
    (*Curl_cfree)(local_70);
    (*Curl_cfree)(local_58);
    u->user = (char *)0x0;
    u->password = (char *)0x0;
    u->options = (char *)0x0;
    if (pvVar7 != (void *)0x0) {
      return CVar6;
    }
    lVar14 = 0;
    pdVar17 = local_48;
  }
  else {
    local_50 = u;
    local_40 = flags;
    if (u->scheme == (char *)0x0) {
      lVar14 = (long)pvVar7 + (1 - (long)auth);
LAB_0016447b:
      optionsp_00 = (char **)0x0;
    }
    else {
      pCVar8 = Curl_get_scheme_handler(u->scheme);
      lVar14 = (long)pvVar7 + (1 - (long)auth);
      if (pCVar8 == (Curl_handler *)0x0) goto LAB_0016447b;
      optionsp_00 = &local_58;
      if ((pCVar8->flags & 0x400) == 0) {
        optionsp_00 = (char **)0x0;
      }
    }
    CVar4 = Curl_parse_login_details(auth,lVar14 - 1,(char **)&local_68,&local_70,optionsp_00);
    pCVar3 = local_50;
    CVar6 = CURLUE_BAD_LOGIN;
    pcVar9 = local_68;
    u = local_50;
    if (CVar4 != CURLE_OK) goto LAB_001644a8;
    if (local_68 != (char *)0x0) {
      CVar6 = CURLUE_USER_NOT_ALLOWED;
      if ((local_40 & 0x20) != 0) goto LAB_001644a8;
      (*Curl_cfree)(local_50->user);
      pCVar3->user = local_68;
    }
    u = local_50;
    if (local_70 != (char *)0x0) {
      (*Curl_cfree)(local_50->password);
      u->password = local_70;
    }
    pdVar17 = local_48;
    if (local_58 != (char *)0x0) {
      (*Curl_cfree)(u->options);
      u->options = local_58;
    }
  }
  CVar4 = Curl_dyn_addn(pdVar17,auth + lVar14,local_38 - lVar14);
  if (CVar4 != CURLE_OK) {
    if (CVar4 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  }
  pcVar9 = Curl_dyn_ptr(pdVar17);
  if (*pcVar9 == '[') {
    pcVar10 = strchr(pcVar9,0x5d);
    if (pcVar10 == (char *)0x0) {
      return CURLUE_BAD_IPV6;
    }
    if (pcVar10[1] != '\0') {
      if (pcVar10[1] != ':') {
        return CURLUE_BAD_PORT_NUMBER;
      }
      pcVar10 = pcVar10 + 1;
LAB_001645f1:
      Curl_dyn_setlen(pdVar17,(long)pcVar10 - (long)pcVar9);
      local_68 = pcVar10 + 1;
      if (pcVar10[1] == '\0') {
        if ((char)local_3c == '\0') {
          return CURLUE_BAD_PORT_NUMBER;
        }
      }
      else {
        iVar5 = Curl_str_number((char **)&local_68,(curl_off_t *)&local_70,0xffff);
        if ((iVar5 != 0) || (*local_68 != '\0')) {
          return CURLUE_BAD_PORT_NUMBER;
        }
        u->portnum = (unsigned_short)local_70;
        (*Curl_cfree)(u->port);
        pcVar9 = curl_maprintf("%ld",local_70);
        u->port = pcVar9;
        if (pcVar9 == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
    }
  }
  else {
    pcVar10 = strchr(pcVar9,0x3a);
    if (pcVar10 != (char *)0x0) goto LAB_001645f1;
  }
  sVar11 = Curl_dyn_len(pdVar17);
  if (sVar11 == 0) {
    CVar6 = CURLUE_NO_HOST;
  }
  else {
    pcVar9 = Curl_dyn_ptr(pdVar17);
    local_68 = (char *)0x0;
    uStack_60 = 0;
    cVar12 = *pcVar9;
    if (cVar12 == '[') {
      local_70 = pcVar9;
      pcVar9 = Curl_dyn_ptr(pdVar17);
      sVar11 = Curl_dyn_len(pdVar17);
      CVar6 = ipv6_parse(u,pcVar9,sVar11);
    }
    else {
      uVar18 = 0;
      while( true ) {
        local_70 = pcVar9;
        if (cVar12 == '0') {
          if (pcVar9[1] == 'x') {
            local_70 = pcVar9 + 2;
            iVar5 = Curl_str_hex(&local_70,(curl_off_t *)&local_58,0xffffffff);
          }
          else {
            iVar5 = Curl_str_octal(&local_70,(curl_off_t *)&local_58,0xffffffff);
          }
        }
        else {
          iVar5 = Curl_str_number(&local_70,(curl_off_t *)&local_58,0xffffffff);
        }
        if (iVar5 != 0) goto LAB_001648a4;
        *(undefined4 *)((long)&local_68 + uVar18 * 4) = local_58._0_4_;
        uVar15 = uStack_60;
        pcVar9 = local_68;
        if (*local_70 != '.') break;
        if (uVar18 == 3) goto LAB_001648a4;
        uVar18 = uVar18 + 1;
        pcVar9 = local_70 + 1;
        cVar12 = local_70[1];
      }
      if (*local_70 == '\0') {
        uVar1 = local_68._4_4_;
        uVar2 = (uint)uStack_60;
        switch(uVar18 & 0xffffffff) {
        case 0:
          Curl_dyn_reset(pdVar17);
          uVar13 = (ulong)((uint)local_68 >> 0x18);
          uVar18 = (ulong)((uint)local_68 >> 0x10 & 0xff);
          uVar15 = (ulong)((uint)local_68 >> 8 & 0xff);
          uVar16 = (ulong)((uint)local_68 & 0xff);
LAB_00164910:
          CVar4 = Curl_dyn_addf(pdVar17,"%u.%u.%u.%u",uVar13,uVar18,uVar15,uVar16);
          if (CVar4 != CURLE_OK) {
            return CURLUE_OUT_OF_MEMORY;
          }
switchD_0016479c_default:
          return CURLUE_OK;
        case 1:
          if (local_68._4_4_ < 0x1000000 && (uint)local_68 < 0x100) {
            Curl_dyn_reset(pdVar17);
            uVar18 = (ulong)(uVar1 >> 0x10);
            uVar15 = (ulong)(uVar1 >> 8 & 0xff);
            uVar13 = (ulong)pcVar9 & 0xffffffff;
            uVar16 = (ulong)(uVar1 & 0xff);
            goto LAB_00164910;
          }
          break;
        case 2:
          if ((uint)uStack_60 < 0x10000 && (local_68._4_4_ < 0x100 && (uint)local_68 < 0x100)) {
            Curl_dyn_reset(pdVar17);
            uVar15 = (ulong)(uVar2 >> 8);
            uVar16 = (ulong)(uVar2 & 0xff);
            uVar13 = (ulong)pcVar9 & 0xffffffff;
            uVar18 = (ulong)uVar1;
            goto LAB_00164910;
          }
          break;
        case 3:
          uVar2 = uStack_60._4_4_;
          if ((uStack_60._4_4_ < 0x100 && (uint)uStack_60 < 0x100) &&
              (local_68._4_4_ < 0x100 && (uint)local_68 < 0x100)) {
            Curl_dyn_reset(pdVar17);
            uVar13 = (ulong)pcVar9 & 0xffffffff;
            uVar18 = (ulong)uVar1;
            uVar15 = uVar15 & 0xffffffff;
            uVar16 = (ulong)uVar2;
            goto LAB_00164910;
          }
          break;
        default:
          goto switchD_0016479c_default;
        }
      }
LAB_001648a4:
      CVar6 = urldecode_host(pdVar17);
      pdVar17 = local_48;
      if (CVar6 == CURLUE_OK) {
        pcVar9 = Curl_dyn_ptr(local_48);
        sVar11 = Curl_dyn_len(pdVar17);
        CVar6 = hostname_check(u,pcVar9,sVar11);
      }
    }
  }
  return CVar6;
}

Assistant:

static CURLUcode parse_authority(struct Curl_URL *u,
                                 const char *auth, size_t authlen,
                                 unsigned int flags,
                                 struct dynbuf *host,
                                 bool has_scheme)
{
  size_t offset;
  CURLUcode uc;
  CURLcode result;

  /*
   * Parse the login details and strip them out of the hostname.
   */
  uc = parse_hostname_login(u, auth, authlen, flags, &offset);
  if(uc)
    goto out;

  result = Curl_dyn_addn(host, auth + offset, authlen - offset);
  if(result) {
    uc = cc2cu(result);
    goto out;
  }

  uc = Curl_parse_port(u, host, has_scheme);
  if(uc)
    goto out;

  if(!Curl_dyn_len(host))
    return CURLUE_NO_HOST;

  switch(ipv4_normalize(host)) {
  case HOST_IPV4:
    break;
  case HOST_IPV6:
    uc = ipv6_parse(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_NAME:
    uc = urldecode_host(host);
    if(!uc)
      uc = hostname_check(u, Curl_dyn_ptr(host), Curl_dyn_len(host));
    break;
  case HOST_ERROR:
    uc = CURLUE_OUT_OF_MEMORY;
    break;
  default:
    uc = CURLUE_BAD_HOSTNAME; /* Bad IPv4 address even */
    break;
  }

out:
  return uc;
}